

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

void __thiscall t_php_generator::init_generator(t_php_generator *this)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  int *piVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *pcVar7;
  long *plVar8;
  size_type *psVar9;
  pointer pbVar10;
  string f_types_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  NSx;
  string local_a8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  char *local_68 [2];
  char local_58 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_a8,this);
  iVar3 = mkdir(local_a8._M_dataplus._M_p,0x1ff);
  paVar1 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (iVar3 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 != 0x11) {
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_68,this);
      std::__cxx11::string::string((string *)&local_88,local_68[0],(allocator *)&local_48);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
      local_a8._M_dataplus._M_p = (pointer)*plVar5;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_a8._M_dataplus._M_p == psVar9) {
        local_a8.field_2._M_allocated_capacity = *psVar9;
        local_a8.field_2._8_8_ = plVar5[3];
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      }
      else {
        local_a8.field_2._M_allocated_capacity = *psVar9;
      }
      local_a8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      pcVar7 = strerror(*piVar4);
      std::operator+(pbVar6,&local_a8,pcVar7);
      __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  php_namespace_suffix_abi_cxx11_
            (&local_a8,this,(this->super_t_oop_generator).super_t_generator.program_);
  split(&local_48,this,&local_a8,'\\');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_a8,this);
  this_00 = &this->package_dir_;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar10 = local_48.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_68[0] = local_58;
      pcVar2 = (this->package_dir_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,pcVar2,pcVar2 + (this->package_dir_)._M_string_length);
      std::__cxx11::string::append((char *)local_68);
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_68,(ulong)(pbVar10->_M_dataplus)._M_p);
      local_88 = &local_78;
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        local_78 = *plVar8;
        lStack_70 = plVar5[3];
      }
      else {
        local_78 = *plVar8;
        local_88 = (long *)*plVar5;
      }
      local_80 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_a8.field_2._M_allocated_capacity = *psVar9;
        local_a8.field_2._8_8_ = plVar5[3];
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      }
      else {
        local_a8.field_2._M_allocated_capacity = *psVar9;
        local_a8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_a8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88);
      }
      if (local_68[0] != local_58) {
        operator_delete(local_68[0]);
      }
      iVar3 = mkdir((this_00->_M_dataplus)._M_p,0x1ff);
      if (iVar3 == -1) {
        piVar4 = __errno_location();
        if (*piVar4 != 0x11) {
          pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::__cxx11::string::string
                    ((string *)&local_88,(this_00->_M_dataplus)._M_p,(allocator *)local_68);
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_88);
          local_a8._M_dataplus._M_p = (pointer)*plVar5;
          psVar9 = (size_type *)(plVar5 + 2);
          if ((size_type *)local_a8._M_dataplus._M_p == psVar9) {
            local_a8.field_2._M_allocated_capacity = *psVar9;
            local_a8.field_2._8_8_ = plVar5[3];
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          }
          else {
            local_a8.field_2._M_allocated_capacity = *psVar9;
          }
          local_a8._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          pcVar7 = strerror(*piVar4);
          std::operator+(pbVar6,&local_a8,pcVar7);
          __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
      }
      pbVar10 = pbVar10 + 1;
    } while (pbVar10 !=
             local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (this->classmap_ != false) {
    pcVar2 = (this->package_dir_)._M_dataplus._M_p;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar2,pcVar2 + (this->package_dir_)._M_string_length);
    std::__cxx11::string::append((char *)&local_a8);
    std::__cxx11::string::string
              ((string *)&local_88,local_a8._M_dataplus._M_p,(allocator *)local_68);
    std::__cxx11::string::_M_assign
              ((string *)
               &(this->f_types_).super_ostringstream.
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
    clear_buf(&this->f_types_);
    (this->f_types_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
    field_0x90 = 0;
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    generate_program_header(this,(ostream *)&this->f_types_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void t_php_generator::init_generator() {
  // Make output directory
  MKDIR(get_out_dir().c_str());

  // Create Real directory Namespaces
  vector<string> NSx = split(php_namespace_suffix(get_program()), '\\');
  package_dir_ = get_out_dir();

  for (const auto & i : NSx) {
    package_dir_ = package_dir_ + "/" + i + "/";
    MKDIR(package_dir_.c_str());
  }

  // Prepare output file for all the types in classmap mode
  if (classmap_) {
    // Make output file
    string f_types_name = package_dir_ + "Types.php";
    f_types_.open(f_types_name.c_str());
    generate_program_header(f_types_);
  }
}